

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

void ImfHeaderDataWindow(ImfHeader *hdr,int *xMin,int *yMin,int *xMax,int *yMax)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  ImfHeader *in_RDI;
  undefined4 *in_R8;
  Box2i dw;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::dataWindow((Header *)0x19ae7f);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *in_RSI = in_stack_ffffffffffffffc8;
  *in_RDX = in_stack_ffffffffffffffcc;
  *in_RCX = in_stack_ffffffffffffffd0;
  *in_R8 = in_stack_ffffffffffffffd4;
  return;
}

Assistant:

void
ImfHeaderDataWindow (
    const ImfHeader* hdr, int* xMin, int* yMin, int* xMax, int* yMax)
{
    const Box2i dw = header (hdr)->dataWindow ();
    *xMin          = dw.min.x;
    *yMin          = dw.min.y;
    *xMax          = dw.max.x;
    *yMax          = dw.max.y;
}